

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asserter.cpp
# Opt level: O0

void CppUnit::Asserter::failIf(bool shouldFail,string *message,SourceLine *sourceLine)

{
  allocator<char> local_b9;
  string local_b8;
  Message local_98;
  SourceLine *local_20;
  SourceLine *sourceLine_local;
  string *message_local;
  bool shouldFail_local;
  
  local_20 = sourceLine;
  sourceLine_local = (SourceLine *)message;
  message_local._7_1_ = shouldFail;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"assertion failed",&local_b9);
  Message::Message(&local_98,&local_b8,message);
  failIf(shouldFail,&local_98,local_20);
  Message::~Message(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void 
Asserter::failIf( bool shouldFail, 
                  std::string message, 
                  const SourceLine &sourceLine )
{
  failIf( shouldFail, Message( "assertion failed", message ), sourceLine );
}